

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeModel.cpp
# Opt level: O1

Expression * soul::ExpressionHelpers::create(Expression *__return_storage_ptr__,Type *t)

{
  Category CVar1;
  bool bVar2;
  char cVar3;
  uint uVar4;
  long *plVar5;
  Structure *s;
  ulong uVar6;
  size_type *psVar7;
  pointer pSVar8;
  char cVar9;
  char *__s;
  ulong uVar10;
  undefined1 local_298 [32];
  undefined1 local_278 [32];
  undefined1 local_258 [16];
  StructurePtr SStack_248;
  Expression local_240;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  Expression local_c8;
  Expression local_b0;
  Expression local_98;
  Expression local_80;
  Expression local_68;
  Expression local_50;
  Expression local_38;
  
  if (t->isConstant == true) {
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"const ","");
    createKeyword(&local_38,&local_e8);
    Type::removeConst((Type *)local_278,t);
    create((Expression *)local_298,(Type *)local_278);
    operator+(__return_storage_ptr__,&local_38,(Expression *)local_298);
    std::
    vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
    ::~vector((vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
               *)local_298);
    RefCountedPtr<soul::Structure>::decIfNotNull((Structure *)local_278._16_8_);
    std::
    vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
    ::~vector(&local_38.sections);
    local_168.field_2._M_allocated_capacity = local_e8.field_2._M_allocated_capacity;
    local_168._M_dataplus._M_p = local_e8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p == &local_e8.field_2) {
      return __return_storage_ptr__;
    }
  }
  else {
    if (t->isRef == true) {
      Type::removeReference((Type *)local_298,t);
      create(&local_50,(Type *)local_298);
      local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"&","");
      createText((Expression *)local_278,&local_188);
      operator+(__return_storage_ptr__,&local_50,(Expression *)local_278);
      std::
      vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
      ::~vector((vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                 *)local_278);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
      ::~vector(&local_50.sections);
      RefCountedPtr<soul::Structure>::decIfNotNull((Structure *)local_298._16_8_);
      return __return_storage_ptr__;
    }
    CVar1 = t->category;
    if (CVar1 == vector) {
      local_258._4_4_ = (t->primitiveType).type;
      local_258[0] = local_258._4_4_ != invalid;
      local_258[1] = invalid;
      local_258[2] = false;
      local_258[3] = false;
      local_258._8_8_ = (pointer)0x0;
      SStack_248.object = (Structure *)0x0;
      create(&local_68,(Type *)local_258);
      CVar1 = t->category;
      uVar10 = (ulong)CVar1;
      if (CVar1 != primitive) {
        if (CVar1 != vector) {
          throwInternalCompilerError("isVector()","getVectorSize",0xf7);
        }
        uVar10 = (ulong)t->boundingSize;
      }
      cVar9 = '\x01';
      if (9 < uVar10) {
        uVar6 = uVar10;
        cVar3 = '\x04';
        do {
          cVar9 = cVar3;
          if (uVar6 < 100) {
            cVar9 = cVar9 + -2;
            goto LAB_002674fa;
          }
          if (uVar6 < 1000) {
            cVar9 = cVar9 + -1;
            goto LAB_002674fa;
          }
          if (uVar6 < 10000) goto LAB_002674fa;
          bVar2 = 99999 < uVar6;
          uVar6 = uVar6 / 10000;
          cVar3 = cVar9 + '\x04';
        } while (bVar2);
        cVar9 = cVar9 + '\x01';
      }
LAB_002674fa:
      local_278._0_8_ = (pointer)(local_278 + 0x10);
      std::__cxx11::string::_M_construct((ulong)local_278,cVar9);
      std::__detail::__to_chars_10_impl<unsigned_long>
                ((char *)local_278._0_8_,local_278._8_4_,uVar10);
      plVar5 = (long *)std::__cxx11::string::replace((ulong)local_278,0,(char *)0x0,0x289d5e);
      pSVar8 = (pointer)(plVar5 + 2);
      if ((pointer)*plVar5 == pSVar8) {
        local_298._16_8_ = *(undefined8 *)pSVar8;
        local_298._24_8_ = plVar5[3];
        local_298._0_8_ = (pointer)(local_298 + 0x10);
      }
      else {
        local_298._16_8_ = *(undefined8 *)pSVar8;
        local_298._0_8_ = (pointer)*plVar5;
      }
      local_298._8_8_ = plVar5[1];
      *plVar5 = (long)pSVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append(local_298);
      psVar7 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_1c8.field_2._M_allocated_capacity = *psVar7;
        local_1c8.field_2._8_8_ = plVar5[3];
        local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
      }
      else {
        local_1c8.field_2._M_allocated_capacity = *psVar7;
        local_1c8._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_1c8._M_string_length = plVar5[1];
      *plVar5 = (long)psVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      createText(&local_240,&local_1c8);
      operator+(__return_storage_ptr__,&local_68,&local_240);
      std::
      vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
      ::~vector(&local_240.sections);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_298._0_8_ != (pointer)(local_298 + 0x10)) {
        operator_delete((void *)local_298._0_8_,(ulong)(local_298._16_8_ + 1));
      }
      if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
        operator_delete((void *)local_278._0_8_,(ulong)(local_278._16_8_ + 1));
      }
      std::
      vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
      ::~vector(&local_68.sections);
      RefCountedPtr<soul::Structure>::decIfNotNull(SStack_248.object);
      return __return_storage_ptr__;
    }
    if ((CVar1 == array) && (t->boundingSize == 0)) {
      Type::getArrayElementType((Type *)local_298,t);
      create(&local_80,(Type *)local_298);
      local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"[]","");
      createText((Expression *)local_278,&local_1a8);
      operator+(__return_storage_ptr__,&local_80,(Expression *)local_278);
      std::
      vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
      ::~vector((vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                 *)local_278);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
      ::~vector(&local_80.sections);
      RefCountedPtr<soul::Structure>::decIfNotNull((Structure *)local_298._16_8_);
      return __return_storage_ptr__;
    }
    if (CVar1 == array) {
      Type::getArrayElementType((Type *)local_258,t);
      create(&local_98,(Type *)local_258);
      if (t->category != array) {
        throwInternalCompilerError("isArray()","getArraySize",0x128);
      }
      uVar10 = (ulong)t->boundingSize;
      cVar9 = '\x01';
      if (9 < uVar10) {
        uVar6 = uVar10;
        cVar3 = '\x04';
        do {
          cVar9 = cVar3;
          if (uVar6 < 100) {
            cVar9 = cVar9 + -2;
            goto LAB_002677bd;
          }
          if (uVar6 < 1000) {
            cVar9 = cVar9 + -1;
            goto LAB_002677bd;
          }
          if (uVar6 < 10000) goto LAB_002677bd;
          bVar2 = 99999 < uVar6;
          uVar6 = uVar6 / 10000;
          cVar3 = cVar9 + '\x04';
        } while (bVar2);
        cVar9 = cVar9 + '\x01';
      }
LAB_002677bd:
      local_278._0_8_ = (pointer)(local_278 + 0x10);
      std::__cxx11::string::_M_construct((ulong)local_278,cVar9);
      std::__detail::__to_chars_10_impl<unsigned_long>
                ((char *)local_278._0_8_,local_278._8_4_,uVar10);
      plVar5 = (long *)std::__cxx11::string::replace((ulong)local_278,0,(char *)0x0,0x2b016a);
      pSVar8 = (pointer)(plVar5 + 2);
      if ((pointer)*plVar5 == pSVar8) {
        local_298._16_8_ = *(undefined8 *)pSVar8;
        local_298._24_8_ = plVar5[3];
        local_298._0_8_ = (pointer)(local_298 + 0x10);
      }
      else {
        local_298._16_8_ = *(undefined8 *)pSVar8;
        local_298._0_8_ = (pointer)*plVar5;
      }
      local_298._8_8_ = plVar5[1];
      *plVar5 = (long)pSVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append(local_298);
      psVar7 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_1e8.field_2._M_allocated_capacity = *psVar7;
        local_1e8.field_2._8_8_ = plVar5[3];
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      }
      else {
        local_1e8.field_2._M_allocated_capacity = *psVar7;
        local_1e8._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_1e8._M_string_length = plVar5[1];
      *plVar5 = (long)psVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      createText(&local_240,&local_1e8);
      operator+(__return_storage_ptr__,&local_98,&local_240);
      std::
      vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
      ::~vector(&local_240.sections);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_298._0_8_ != (pointer)(local_298 + 0x10)) {
        operator_delete((void *)local_298._0_8_,(ulong)(local_298._16_8_ + 1));
      }
      if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
        operator_delete((void *)local_278._0_8_,(ulong)(local_278._16_8_ + 1));
      }
      std::
      vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
      ::~vector(&local_98.sections);
      RefCountedPtr<soul::Structure>::decIfNotNull(SStack_248.object);
      return __return_storage_ptr__;
    }
    switch(CVar1) {
    case wrap:
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"wrap","");
      createKeyword(&local_b0,&local_108);
      if ((t->category & ~primitive) != wrap) {
        throwInternalCompilerError("isBoundedInt()","getBoundedIntLimit",0x17d);
      }
      std::__cxx11::to_string((string *)local_278,t->boundingSize);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_298,
                     "<",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_278);
      plVar5 = (long *)std::__cxx11::string::append(local_298);
      psVar7 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_208.field_2._M_allocated_capacity = *psVar7;
        local_208.field_2._8_8_ = plVar5[3];
        local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
      }
      else {
        local_208.field_2._M_allocated_capacity = *psVar7;
        local_208._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_208._M_string_length = plVar5[1];
      *plVar5 = (long)psVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      createText((Expression *)local_258,&local_208);
      operator+(__return_storage_ptr__,&local_b0,(Expression *)local_258);
      std::
      vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
      ::~vector((vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                 *)local_258);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_298._0_8_ != (pointer)(local_298 + 0x10)) {
        operator_delete((void *)local_298._0_8_,(ulong)(local_298._16_8_ + 1));
      }
      if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
        operator_delete((void *)local_278._0_8_,(ulong)(local_278._16_8_ + 1));
      }
      std::
      vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
      ::~vector(&local_b0.sections);
      local_168.field_2._M_allocated_capacity = local_108.field_2._M_allocated_capacity;
      local_168._M_dataplus._M_p = local_108._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p == &local_108.field_2) {
        return __return_storage_ptr__;
      }
      break;
    case clamp:
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"clamp","");
      createKeyword(&local_c8,&local_128);
      if ((t->category & ~primitive) != wrap) {
        throwInternalCompilerError("isBoundedInt()","getBoundedIntLimit",0x17d);
      }
      std::__cxx11::to_string((string *)local_278,t->boundingSize);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_298,
                     "<",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_278);
      plVar5 = (long *)std::__cxx11::string::append(local_298);
      psVar7 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_228.field_2._M_allocated_capacity = *psVar7;
        local_228.field_2._8_8_ = plVar5[3];
        local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
      }
      else {
        local_228.field_2._M_allocated_capacity = *psVar7;
        local_228._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_228._M_string_length = plVar5[1];
      *plVar5 = (long)psVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      createText((Expression *)local_258,&local_228);
      operator+(__return_storage_ptr__,&local_c8,(Expression *)local_258);
      std::
      vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
      ::~vector((vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                 *)local_258);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_298._0_8_ != (pointer)(local_298 + 0x10)) {
        operator_delete((void *)local_298._0_8_,(ulong)(local_298._16_8_ + 1));
      }
      if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
        operator_delete((void *)local_278._0_8_,(ulong)(local_278._16_8_ + 1));
      }
      std::
      vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
      ::~vector(&local_c8.sections);
      local_168.field_2._M_allocated_capacity = local_128.field_2._M_allocated_capacity;
      local_168._M_dataplus._M_p = local_128._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p == &local_128.field_2) {
        return __return_storage_ptr__;
      }
      break;
    case structure:
      s = Type::getStructRef(t);
      createStruct(__return_storage_ptr__,s);
      return __return_storage_ptr__;
    case stringLiteral:
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"string","");
      createPrimitive(__return_storage_ptr__,&local_148);
      local_168.field_2._M_allocated_capacity = local_148.field_2._M_allocated_capacity;
      local_168._M_dataplus._M_p = local_148._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p == &local_148.field_2) {
        return __return_storage_ptr__;
      }
      break;
    default:
      uVar4 = (t->primitiveType).type - void_;
      if (uVar4 < 9) {
        __s = *(char **)(&DAT_00301178 + (ulong)uVar4 * 8);
      }
      else {
        __s = "<unknown>";
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_168,__s,(allocator<char> *)local_298);
      createPrimitive(__return_storage_ptr__,&local_168);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p == &local_168.field_2) {
        return __return_storage_ptr__;
      }
    }
  }
  operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

static SourceCodeModel::Expression create (const Type& t)
    {
        if (t.isConst())          return createKeyword ("const ") + create (t.removeConst());
        if (t.isReference())      return create (t.removeReference()) + createText ("&");
        if (t.isVector())         return create (t.getPrimitiveType()) + createText ("<" + std::to_string (t.getVectorSize()) + ">");
        if (t.isUnsizedArray())   return create (t.getArrayElementType()) + createText ("[]");
        if (t.isArray())          return create (t.getArrayElementType()) + createText ("[" + std::to_string (t.getArraySize()) + "]");
        if (t.isWrapped())        return createKeyword ("wrap") + createText ("<" + std::to_string (t.getBoundedIntLimit()) + ">");
        if (t.isClamped())        return createKeyword ("clamp") + createText ("<" + std::to_string (t.getBoundedIntLimit()) + ">");
        if (t.isStruct())         return createStruct (t.getStructRef());
        if (t.isStringLiteral())  return createPrimitive ("string");

        return createPrimitive (t.getPrimitiveType().getDescription());
    }